

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O3

void helicsFederateGlobalError(HelicsFederate fed,int errorCode,char *errorString,HelicsError *err)

{
  Federate *this;
  FedObject *pFVar1;
  size_t sVar2;
  string_view message;
  long *local_48;
  size_t local_40;
  long local_38 [2];
  
  pFVar1 = helics::getFedObject(fed,err);
  if ((pFVar1 != (FedObject *)0x0) &&
     (this = (pFVar1->fedptr).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr, this != (Federate *)0x0)) {
    local_48 = local_38;
    if (errorString == (char *)0x0) {
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_48,gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p,
                 gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p +
                 gHelicsEmptyStr_abi_cxx11_._M_string_length);
    }
    else {
      sVar2 = strlen(errorString);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,errorString,errorString + sVar2);
    }
    message._M_str = (char *)local_48;
    message._M_len = local_40;
    helics::Federate::globalError(this,errorCode,message);
    if (local_48 != local_38) {
      operator_delete(local_48,local_38[0] + 1);
    }
  }
  return;
}

Assistant:

void helicsFederateGlobalError(HelicsFederate fed, int errorCode, const char* errorString, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return;
    }
    try {
        fedObj->globalError(errorCode, AS_STRING(errorString));
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}